

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DragBehaviorT<float,float,float>
               (ImGuiDataType data_type,float *v,float v_speed,float v_min,float v_max,char *format,
               float power,ImGuiDragFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float local_80;
  ImVec2 local_38;
  
  pIVar1 = GImGui;
  uVar5 = data_type & 0xfffffffe;
  if ((((v_min != v_max) || (bVar3 = false, NAN(v_min) || NAN(v_max))) &&
      ((bVar3 = false, power != 1.0 || (NAN(power))))) && (uVar5 == 8)) {
    bVar3 = v_max - v_min < 3.4028235e+38;
  }
  if ((v_speed == 0.0) && (!NAN(v_speed))) {
    if (((v_min != v_max) || (NAN(v_min) || NAN(v_max))) && (v_max - v_min < 3.4028235e+38)) {
      v_speed = (v_max - v_min) * GImGui->DragSpeedDefaultRatio;
    }
  }
  uVar6 = flags & 1;
  if (GImGui->ActiveIdSource == ImGuiInputSource_Mouse) {
    bVar2 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar2) || ((pIVar1->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) goto LAB_0014fcd1;
    fVar11 = (pIVar1->IO).NavInputs[(ulong)uVar6 + 0x1e];
    if ((pIVar1->IO).KeyAlt != false) {
      fVar11 = fVar11 * 0.01;
    }
    if ((pIVar1->IO).KeyShift == true) {
      fVar11 = fVar11 * 10.0;
    }
  }
  else {
LAB_0014fcd1:
    fVar11 = 0.0;
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
      uVar4 = 0;
      if (uVar5 == 8) {
        uVar4 = ImParseFormatPrecision(format,3);
      }
      local_38 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar11 = (&local_38.x)[uVar6];
      if ((int)uVar4 < 0) {
        fVar10 = 1.1754944e-38;
      }
      else if ((int)uVar4 < 10) {
        fVar10 = *(float *)(GetMinimumStepAtDecimalPrecision(int)::min_steps + (ulong)uVar4 * 4);
      }
      else {
        fVar10 = powf(10.0,(float)(int)-uVar4);
      }
      v_speed = (float)((uint)v_speed & -(uint)(fVar10 <= v_speed) |
                       ~-(uint)(fVar10 <= v_speed) & (uint)fVar10);
    }
  }
  fVar11 = fVar11 * v_speed;
  fVar10 = fVar11;
  if (uVar6 != 0) {
    fVar10 = -fVar11;
  }
  if ((v_min != v_max) || (NAN(v_min) || NAN(v_max))) {
    if ((*v < v_max) || (bVar7 = 1, fVar10 <= 0.0)) {
      bVar7 = -(*v <= v_min && fVar10 < 0.0);
    }
  }
  else {
    bVar7 = 0;
  }
  if (bVar3) {
    if ((0.0 <= fVar10) || (bVar2 = true, pIVar1->DragCurrentAccum <= 0.0)) {
      if (fVar10 <= 0.0) goto LAB_0014fe27;
      bVar2 = pIVar1->DragCurrentAccum <= 0.0 && pIVar1->DragCurrentAccum != 0.0;
    }
  }
  else {
LAB_0014fe27:
    bVar2 = false;
  }
  if ((((pIVar1->ActiveIdIsJustActivated | bVar7) & 1) != 0) || (bVar2)) {
    pIVar1->DragCurrentAccum = 0.0;
    bVar2 = false;
  }
  else {
    if ((fVar11 == 0.0) && (!NAN(fVar11))) goto LAB_0014fe6c;
    pIVar1->DragCurrentAccum = pIVar1->DragCurrentAccum + fVar10;
    bVar2 = true;
  }
  pIVar1->DragCurrentAccumDirty = bVar2;
LAB_0014fe6c:
  if (pIVar1->DragCurrentAccumDirty == true) {
    if (bVar3) {
      fVar9 = v_max - v_min;
      local_80 = powf((*v - v_min) / fVar9,1.0 / power);
      fVar8 = local_80 + pIVar1->DragCurrentAccum / fVar9;
      fVar11 = 1.0;
      if (fVar8 <= 1.0) {
        fVar11 = fVar8;
      }
      fVar11 = powf((float)(~-(uint)(fVar8 < 0.0) & (uint)fVar11),power);
      fVar11 = fVar11 * fVar9 + v_min;
    }
    else {
      fVar11 = *v + pIVar1->DragCurrentAccum;
      local_80 = 0.0;
    }
    fVar11 = RoundScalarWithFormatT<float,float>(format,data_type,fVar11);
    pIVar1->DragCurrentAccumDirty = false;
    if (bVar3) {
      fVar8 = powf((fVar11 - v_min) / (v_max - v_min),1.0 / power);
      fVar8 = fVar8 - local_80;
    }
    else {
      fVar8 = fVar11 - *v;
    }
    pIVar1->DragCurrentAccum = pIVar1->DragCurrentAccum - fVar8;
    fVar11 = (float)(~-(uint)(fVar11 == 0.0) & (uint)fVar11);
    fVar8 = *v;
    if ((v_min != v_max) || (NAN(v_min) || NAN(v_max))) {
      if ((fVar8 != fVar11) || (NAN(fVar8) || NAN(fVar11))) {
        if ((fVar11 < v_min) || (((uVar5 != 8 && (fVar8 < fVar11)) && (fVar10 < 0.0)))) {
          fVar11 = v_min;
        }
        if ((v_max < fVar11) || (((uVar5 != 8 && (fVar11 < fVar8)) && (0.0 < fVar10)))) {
          fVar11 = v_max;
        }
      }
    }
    if ((fVar8 != fVar11) || (NAN(fVar8) || NAN(fVar11))) {
      *v = fVar11;
      bVar3 = true;
    }
    else {
      bVar3 = (bool)(-(fVar8 != fVar11) & 1);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool has_min_max = (v_min != v_max);
    const bool is_power = (power != 1.0f && is_decimal && has_min_max && (v_max - v_min < FLT_MAX));

    // Default tweak speed
    if (v_speed == 0.0f && has_min_max && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = has_min_max && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (TYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (TYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && has_min_max)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}